

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_test_datatype_sizes(int verb)

{
  uint datatype;
  ulong in_RAX;
  uint uVar1;
  long lVar2;
  int ssize;
  int nbyper;
  
  uVar1 = 0;
  _ssize = in_RAX;
  for (lVar2 = 0x10; lVar2 != 0x418; lVar2 = lVar2 + 0x18) {
    _ssize = 0xffffffffffffffff;
    datatype = *(uint *)((long)&__frame_dummy_init_array_entry + lVar2);
    nifti_datatype_sizes(datatype,&nbyper,&ssize);
    if ((((ssize | nbyper) < 0) ||
        (nbyper != *(int *)((long)&__frame_dummy_init_array_entry + lVar2 + 4))) ||
       (ssize != *(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2))) {
      if ((verb != 0) || (2 < g_opts_0)) {
        fprintf(_stderr,"** type mismatch: %s, %d, %d, %d : %d, %d\n",
                *(undefined8 *)((long)&nifti_type_list[0].type + lVar2),(ulong)datatype,
                (ulong)*(uint *)((long)&__frame_dummy_init_array_entry + lVar2 + 4),
                (ulong)*(uint *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2),
                (ulong)(uint)nbyper,_ssize & 0xffffffff);
      }
      uVar1 = uVar1 + 1;
    }
  }
  if (uVar1 == 0) {
    if ((verb != 0) || (1 < g_opts_0)) {
      fwrite("-- nifti_test_datatype_sizes: all OK\n",0x25,1,_stderr);
    }
  }
  else {
    fprintf(_stderr,"** nifti_test_datatype_sizes: found %d errors\n",(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

int nifti_test_datatype_sizes(int verb)
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int nbyper, ssize;
    int c, errs = 0;

    for( c = 0; c < tablen; c++ )
    {
        nbyper = ssize = -1;
        nifti_datatype_sizes(nifti_type_list[c].type, &nbyper, &ssize);
        if( nbyper < 0 || ssize < 0 ||
                nbyper != nifti_type_list[c].nbyper ||
                ssize != nifti_type_list[c].swapsize )
        {
            if( verb || g_opts.debug > 2 )
                fprintf(stderr, "** type mismatch: %s, %d, %d, %d : %d, %d\n",
                    nifti_type_list[c].name, nifti_type_list[c].type,
                    nifti_type_list[c].nbyper, nifti_type_list[c].swapsize,
                    nbyper, ssize);
            errs++;
        }
    }

    if( errs )
        fprintf(stderr,"** nifti_test_datatype_sizes: found %d errors\n",errs);
    else if( verb || g_opts.debug > 1 )
        fprintf(stderr,"-- nifti_test_datatype_sizes: all OK\n");

    return errs;
}